

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandRMD(FtpSession *this,string *param)

{
  bool bVar1;
  Permission PVar2;
  int iVar3;
  element_type *peVar4;
  char *__path;
  allocator local_e1;
  string local_e0 [32];
  undefined4 local_c0;
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  string local_path;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  object_fns *local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = (object_fns *)param;
  param_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (bVar1) {
    peVar4 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->logged_in_user_);
    PVar2 = operator&(peVar4->permissions_,DirDelete);
    if (PVar2 == None) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_70,"Permission denied",&local_71);
      sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_70);
      ::std::__cxx11::string::~string(local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      toLocalPath((FtpSession *)local_98,(string *)this);
      __path = (char *)::std::__cxx11::string::c_str();
      iVar3 = rmdir(__path);
      if (iVar3 == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_b8,"Successfully removed directory",&local_b9);
        sendFtpMessage(this,FILE_ACTION_COMPLETED,(string *)local_b8);
        ::std::__cxx11::string::~string(local_b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_e0,"Unable to remove directory",&local_e1);
        sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_e0);
        ::std::__cxx11::string::~string(local_e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      local_c0 = 1;
      ::std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandRMD(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirDelete) == 0)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);

#ifdef WIN32
    if (RemoveDirectoryW(StrConvert::Utf8ToWide(local_path).c_str()) != 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully removed directory");
      return;
    }
    else
    {
      // If would be a good idea to return a 4xx error code here (-> temp error)
      // (e.g. FILE_ACTION_NOT_TAKEN), but RFC 959 assumes that all directory
      // errors are permanent.
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Unable to remove directory: " + GetLastErrorStr());
      return;
    }
#else
    if (rmdir(local_path.c_str()) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully removed directory");
      return;
    }
    else
    {
      // If would be a good idea to return a 4xx error code here (-> temp error)
      // (e.g. FILE_ACTION_NOT_TAKEN), but RFC 959 assumes that all directory
      // errors are permanent.
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Unable to remove directory");
      return;
    }
#endif

  }